

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt(TextReader<fmt::Locale> *this,int *accumulator)

{
  uint uVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  uVar1 = ReadUInt<int>(this);
  if ((int)(uVar1 ^ 0x7fffffff) < *accumulator) {
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x173104,&local_28);
  }
  *accumulator = *accumulator + uVar1;
  return uVar1;
}

Assistant:

int ReadUInt(int &accumulator) {
    int value = ReadUInt();
    if (accumulator > std::numeric_limits<int>::max() - value)
      ReportError("integer overflow");
    accumulator += value;
    return value;
  }